

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrecurse.c
# Opt level: O0

xmlParserInputPtr testExternalEntityLoader(char *URL,char *ID,xmlParserCtxtPtr ctxt)

{
  int iVar1;
  int iVar2;
  xmlParserInputPtr pxStack_28;
  int memused;
  xmlParserInputPtr ret;
  xmlParserCtxtPtr ctxt_local;
  char *ID_local;
  char *URL_local;
  
  iVar1 = checkTestFile(URL);
  if (iVar1 == 0) {
    iVar1 = xmlMemUsed();
    pxStack_28 = (xmlParserInputPtr)xmlNoNetExternalEntityLoader(URL,ID,ctxt);
    iVar2 = xmlMemUsed();
    extraMemoryFromResolver = (iVar2 - iVar1) + extraMemoryFromResolver;
  }
  else {
    pxStack_28 = (xmlParserInputPtr)xmlNoNetExternalEntityLoader(URL,ID,ctxt);
  }
  return pxStack_28;
}

Assistant:

static xmlParserInputPtr
testExternalEntityLoader(const char *URL, const char *ID,
			 xmlParserCtxtPtr ctxt) {
    xmlParserInputPtr ret;

    if (checkTestFile(URL)) {
	ret = xmlNoNetExternalEntityLoader(URL, ID, ctxt);
    } else {
	int memused = xmlMemUsed();
	ret = xmlNoNetExternalEntityLoader(URL, ID, ctxt);
	extraMemoryFromResolver += xmlMemUsed() - memused;
    }

    return(ret);
}